

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O0

bool __thiscall node::Warnings::Set(Warnings *this,warning_type id,bilingual_str *message)

{
  long lVar1;
  type_conflict3 *ptVar2;
  long in_FS_OFFSET;
  type *inserted;
  type *_;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  Set::anon_class_24_3_d81e3611::operator()
            ((anon_class_24_3_d81e3611 *)
             CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0));
  std::
  get<0ul,std::_Rb_tree_iterator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,bool>
            ((pair<std::_Rb_tree_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_bool>
              *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  ptVar2 = std::
           get<1ul,std::_Rb_tree_iterator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,bool>
                     ((pair<std::_Rb_tree_iterator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_bool>
                       *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if ((*ptVar2 & 1U) != 0) {
    CClientUIInterface::NotifyAlertChanged
              ((CClientUIInterface *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(*ptVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Warnings::Set(warning_type id, bilingual_str message)
{
    const auto& [_, inserted]{WITH_LOCK(m_mutex, return m_warnings.insert({id, std::move(message)}))};
    if (inserted) uiInterface.NotifyAlertChanged();
    return inserted;
}